

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance_test.cc
# Opt level: O0

Test * EditDistanceTestTestAllowReplacements::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x10);
  EditDistanceTestTestAllowReplacements((EditDistanceTestTestAllowReplacements *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST(EditDistanceTest, TestAllowReplacements) {
  bool allow_replacements = true;
  EXPECT_EQ(1, EditDistance("ninja", "njnja", allow_replacements));
  EXPECT_EQ(1, EditDistance("njnja", "ninja", allow_replacements));

  allow_replacements = false;
  EXPECT_EQ(2, EditDistance("ninja", "njnja", allow_replacements));
  EXPECT_EQ(2, EditDistance("njnja", "ninja", allow_replacements));
}